

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::quatf> *value)

{
  storage_t<tinyusdz::value::quatf> sVar1;
  bool bVar2;
  float4 v;
  array<float,_4UL> local_28;
  
  bVar2 = MaybeNone(this);
  if (bVar2) {
    value->has_value_ = false;
    bVar2 = true;
  }
  else {
    bVar2 = ParseBasicTypeTuple<float,4ul>(this,&local_28);
    if (bVar2) {
      sVar1._12_4_ = local_28._M_elems[0];
      sVar1._0_12_ = local_28._M_elems._4_12_;
      value->contained = sVar1;
      bVar2 = true;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::quatf> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::quatf v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}